

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall mkvparser::Tags::SimpleTag::Clear(SimpleTag *this)

{
  if (this->m_tag_name != (char *)0x0) {
    operator_delete__(this->m_tag_name);
  }
  this->m_tag_name = (char *)0x0;
  if (this->m_tag_string != (char *)0x0) {
    operator_delete__(this->m_tag_string);
  }
  this->m_tag_string = (char *)0x0;
  return;
}

Assistant:

void Tags::SimpleTag::Clear() {
  delete[] m_tag_name;
  m_tag_name = NULL;

  delete[] m_tag_string;
  m_tag_string = NULL;
}